

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallLeafHeapBlock.cpp
# Opt level: O0

SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *
Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>::New
          (HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *bucket)

{
  code *pcVar1;
  bool bVar2;
  HeapAllocator *pHVar3;
  size_t sVar4;
  SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *this;
  undefined8 *in_FS_OFFSET;
  TrackAllocData local_40;
  ushort local_14;
  ushort local_12;
  ushort objectCount;
  HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *pHStack_10;
  ushort objectSize;
  HeapBucketT<Memory::SmallLeafHeapBlockT<MediumAllocationBlockAttributes>_> *bucket_local;
  
  pHStack_10 = bucket;
  if (0x2000 < (bucket->super_HeapBucket).sizeCat) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallLeafHeapBlock.cpp"
                       ,0xd,"(bucket->sizeCat <= TBlockAttributes::MaxObjectSize)",
                       "bucket->sizeCat <= TBlockAttributes::MaxObjectSize");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  if (0xffff < SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x8000)) /
                      ZEXT416((pHStack_10->super_HeapBucket).sizeCat),0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallLeafHeapBlock.cpp"
                       ,0xe,
                       "((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucket->sizeCat <= (32767 * 2 + 1))"
                       ,
                       "(TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucket->sizeCat <= USHRT_MAX"
                      );
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  local_12 = (ushort)(pHStack_10->super_HeapBucket).sizeCat;
  local_14 = SUB162((ZEXT816(0) << 0x40 | ZEXT816(0x8000)) / ZEXT216(local_12),0);
  pHVar3 = HeapAllocator::GetNoMemProtectInstance();
  sVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAllocPlusSize((uint)local_14);
  TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&typeinfo,sVar4,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallLeafHeapBlock.cpp"
             ,0x12);
  pHVar3 = HeapAllocator::TrackAllocInfo(pHVar3,&local_40);
  sVar4 = SmallHeapBlockT<MediumAllocationBlockAttributes>::GetAllocPlusSize((uint)local_14);
  this = (SmallLeafHeapBlockT<MediumAllocationBlockAttributes> *)
         new<Memory::HeapAllocator>(0x570,pHVar3,true,0x282340,0,SUB81(sVar4,0));
  SmallLeafHeapBlockT(this,pHStack_10,local_12,local_14);
  return this;
}

Assistant:

SmallLeafHeapBlockT<TBlockAttributes> *
SmallLeafHeapBlockT<TBlockAttributes>::New(HeapBucketT<SmallLeafHeapBlockT<TBlockAttributes>> * bucket)
{
    CompileAssert(TBlockAttributes::MaxObjectSize <= USHRT_MAX);
    Assert(bucket->sizeCat <= TBlockAttributes::MaxObjectSize);
    Assert((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / bucket->sizeCat <= USHRT_MAX);

    ushort objectSize = (ushort)bucket->sizeCat;
    ushort objectCount = (ushort)((TBlockAttributes::PageCount * AutoSystemInfo::PageSize) / objectSize);
    return NoMemProtectHeapNewNoThrowPlusPrefixZ(Base::GetAllocPlusSize(objectCount), SmallLeafHeapBlockT<TBlockAttributes>, bucket, objectSize, objectCount);
}